

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::haarTransform<double>(void)

{
  bool bVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t id_1;
  vector<double,_std::allocator<double>_> inverse;
  size_t id;
  vector<double,_std::allocator<double>_> direct;
  vector<double,_std::allocator<double>_> input;
  uint32_t height;
  uint32_t width;
  uint32_t i;
  value_type in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff20;
  double in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  double local_90;
  allocator_type local_81;
  vector<double,_std::allocator<double>_> local_80;
  ulong local_68;
  vector<double,_std::allocator<double>_> local_58 [2];
  vector<double,_std::allocator<double>_> local_28;
  int local_10;
  int local_c;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar4 = local_8, uVar3 = Test_Helper::runCount(), uVar4 < uVar3;
      local_8 = local_8 + 1) {
    uVar4 = Test_Helper::randomValue<unsigned_int>
                      (SUB84(in_stack_ffffffffffffff10,0),
                       (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_c = uVar4 * 2;
    uVar4 = Test_Helper::randomValue<unsigned_int>
                      (SUB84(in_stack_ffffffffffffff10,0),
                       (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_10 = uVar4 * 2;
    std::allocator<double>::allocator((allocator<double> *)0x24afae);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::allocator<double>::~allocator((allocator<double> *)0x24afd4);
    std::allocator<double>::allocator((allocator<double> *)0x24affc);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::allocator<double>::~allocator((allocator<double> *)0x24b022);
    for (local_68 = 0; uVar2 = local_68,
        sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_28), uVar2 < sVar5;
        local_68 = local_68 + 1) {
      in_stack_ffffffffffffff28 =
           Unit_Test::randomFloatValue<double>
                     ((double)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff08);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,local_68);
      *pvVar6 = in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff30 =
           (vector<double,_std::allocator<double>_> *)
           Unit_Test::randomFloatValue<double>
                     ((double)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff08);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_58,local_68);
      *pvVar6 = (value_type)in_stack_ffffffffffffff30;
    }
    in_stack_ffffffffffffff18 =
         (vector<double,_std::allocator<double>_> *)(ulong)(uint)(local_c * local_10);
    in_stack_ffffffffffffff20 = &local_81;
    std::allocator<double>::allocator((allocator<double> *)0x24b15f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::allocator<double>::~allocator((allocator<double> *)0x24b17f);
    Image_Function::HaarDirectTransform
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               (size_t)in_stack_ffffffffffffff08);
    Image_Function::HaarInverseTransform
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
               (size_t)in_stack_ffffffffffffff08);
    local_90 = 0.0;
    while (in_stack_ffffffffffffff10 = local_90,
          dVar7 = (double)std::vector<double,_std::allocator<double>_>::size(&local_28),
          (ulong)in_stack_ffffffffffffff10 < (ulong)dVar7) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_28,(size_type)local_90);
      in_stack_ffffffffffffff08 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_80,(size_type)local_90);
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = in_stack_ffffffffffffff08 - *pvVar6;
      auVar8 = vpand_avx(auVar8,auVar9);
      if (0.0010000000474974513 < auVar8._0_8_) {
        local_1 = 0;
        bVar1 = true;
        goto LAB_0024b2bf;
      }
      local_90 = (double)((long)local_90 + 1);
    }
    bVar1 = false;
LAB_0024b2bf:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
    if (bVar1) goto LAB_0024b32b;
  }
  local_1 = 1;
LAB_0024b32b:
  return (bool)(local_1 & 1);
}

Assistant:

bool haarTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width  = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2; // to make sure that number is divided by 2
            const uint32_t height = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2;
            std::vector< _Type > input ( width * height );
            std::vector< _Type > direct( width * height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                input [id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
                direct[id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
            }

            std::vector< _Type > inverse ( width * height );
            Image_Function::HaarDirectTransform ( input, direct, width, height );
            Image_Function::HaarInverseTransform( direct, inverse, width, height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                if (std::fabs(input[id] - inverse[id]) > 0.001f)
                    return false;
            }
        }

        return true;
    }